

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_3>::Serialize
               (void *ptr,ArrayOutput *output)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pbVar1 = output->ptr;
  uVar4 = *ptr;
  *pbVar1 = (byte)uVar4;
  if (uVar4 < 0x80) {
    pbVar3 = pbVar1 + 1;
  }
  else {
    *pbVar1 = (byte)uVar4 | 0x80;
    pbVar1[1] = (byte)(uVar4 >> 7);
    pbVar3 = pbVar1 + 2;
    if (0x3fff < uVar4) {
      uVar6 = (ulong)pbVar1[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar3[-1] = (byte)uVar6 | 0x80;
        uVar5 = uVar4 >> 7;
        *pbVar3 = (byte)uVar5;
        pbVar3 = pbVar3 + 1;
        uVar6 = uVar5 & 0xffffffff;
        bVar2 = 0x3fff < uVar4;
        uVar4 = uVar5;
      } while (bVar2);
    }
  }
  output->ptr = pbVar3;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }